

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  bool bVar1;
  size_type sVar2;
  StringPiece str;
  string result;
  string name;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  StringPiece local_88;
  string local_78;
  string local_58;
  string local_38;
  
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)this,field);
  anon_unknown_0::UnderscoresToCamelCase(&local_a8,&local_38,false);
  if (((~(byte)this[1] & 0x60) != 0) ||
     (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)this), bVar1)) {
    sVar2 = stringpiece_internal::StringPiece::CheckSize(local_a8._M_string_length);
    stringpiece_internal::StringPiece::StringPiece(&local_88,"Array");
    str.length_ = sVar2;
    str.ptr_ = local_a8._M_dataplus._M_p;
    bVar1 = HasSuffixString(str,local_88);
    if (!bVar1) goto LAB_002adf76;
  }
  std::__cxx11::string::append((char *)&local_a8);
LAB_002adf76:
  std::__cxx11::string::string((string *)&local_58,"",&local_a9);
  std::__cxx11::string::string((string *)&local_78,"_p",&local_aa);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,&local_58,&local_a8,&local_78,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldName(const FieldDescriptor* field) {
  const std::string name = NameFromFieldDescriptor(field);
  std::string result = UnderscoresToCamelCase(name, false);
  if (field->is_repeated() && !field->is_map()) {
    // Add "Array" before do check for reserved worlds.
    result += "Array";
  } else {
    // If it wasn't repeated, but ends in "Array", force on the _p suffix.
    if (HasSuffixString(result, "Array")) {
      result += "_p";
    }
  }
  return SanitizeNameForObjC("", result, "_p", NULL);
}